

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O2

int __thiscall cmCursesMainForm::Generate(cmCursesMainForm *this)

{
  bool bVar1;
  cmCursesLongMessageForm *this_00;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  char *title;
  _Any_data local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  iVar3 = -1;
  uVar6 = 0xffffffff;
  uVar2 = 0xffffffff;
  if (_stdscr != 0) {
    uVar6 = (ulong)((int)*(short *)(_stdscr + 4) + 1);
    uVar2 = (int)*(short *)(_stdscr + 6) + 1;
  }
  move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Generating, please wait...");
  PrintKeys(this,1);
  if (_stdscr != 0) {
    iVar3 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,iVar3);
  refresh();
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/cmCursesMainForm.cxx:592:5)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CursesDialog/cmCursesMainForm.cxx:592:5)>
             ::_M_manager;
  local_68._M_unused._M_object = this;
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType *)&local_68);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(&this->Errors,&local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  iVar3 = cmake::Generate(this->CMakeInstance);
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_78 = 0;
  uStack_70 = 0;
  cmake::SetProgressCallback(this->CMakeInstance,(ProgressCallbackType *)&local_88);
  std::_Function_base::~_Function_base((_Function_base *)&local_88);
  keypad(_stdscr,1);
  if ((iVar3 != 0) ||
     ((this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->Errors).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar1) {
      this->OkToGenerate = false;
    }
    cmSystemTools::s_FatalErrorOccured = false;
    cmSystemTools::s_ErrorOccured = false;
    if (_stdscr == 0) {
      uVar5 = 0xffffffff;
      uVar4 = 0xffffffff;
    }
    else {
      uVar5 = (int)*(short *)(_stdscr + 4) + 1;
      uVar4 = (int)*(short *)(_stdscr + 6) + 1;
    }
    bVar1 = cmSystemTools::GetErrorOccuredFlag();
    title = "Messages during last pass.";
    if (bVar1) {
      title = "Errors occurred during the last pass.";
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Errors,title);
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])(this_00,1,1,(ulong)uVar4,(ulong)uVar5);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])(this_00);
    if (iVar3 == -2) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar4,(ulong)uVar5);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)uVar2,uVar6);
  return 0;
}

Assistant:

int cmCursesMainForm::Generate()
{
  int xi, yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1, 1);
  this->UpdateStatusBar("Generating, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(
    [this](const std::string& msg, float prog) {
      this->UpdateProgress(msg, prog);
    });

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  int retVal = this->CMakeInstance->Generate();

  this->CMakeInstance->SetProgressCallback(nullptr);
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || !this->Errors.empty()) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccuredFlag()) {
      this->OkToGenerate = false;
    }
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    int xx, yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Messages during last pass.";
    if (cmSystemTools::GetErrorOccuredFlag()) {
      title = "Errors occurred during the last pass.";
    }
    cmCursesLongMessageForm* msgs =
      new cmCursesLongMessageForm(this->Errors, title);
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
    CurrentForm = this;
    this->Render(1, 1, xx, yy);
  }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}